

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collision.cc
# Opt level: O1

bool __thiscall apollonia::Arbiter::operator==(Arbiter *this,Arbiter *other)

{
  Body *pBVar1;
  Body *pBVar2;
  Body *pBVar3;
  Contact *this_00;
  pointer pCVar4;
  bool bVar5;
  Body *b1;
  Body *pBVar6;
  Body *a2;
  Body *pBVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  
  pBVar1 = this->a_;
  pBVar7 = this->b_;
  pBVar2 = other->a_;
  pBVar3 = other->b_;
  pBVar6 = pBVar7;
  if (pBVar7 < pBVar1) {
    pBVar6 = pBVar1;
    pBVar1 = pBVar7;
  }
  pBVar7 = pBVar3;
  if (pBVar3 < pBVar2) {
    pBVar7 = pBVar2;
    pBVar2 = pBVar3;
  }
  if (pBVar2 == pBVar1 && pBVar7 == pBVar6) {
    this_00 = (this->contacts_).
              super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>._M_impl.
              super__Vector_impl_data._M_start;
    bVar10 = (this->contacts_).
             super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>._M_impl.
             super__Vector_impl_data._M_finish == this_00;
    if ((!bVar10) &&
       (bVar5 = Contact::operator==(this_00,(other->contacts_).
                                            super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>
                                            ._M_impl.super__Vector_impl_data._M_start), bVar5)) {
      uVar9 = 0;
      lVar8 = 0x48;
      do {
        uVar9 = uVar9 + 1;
        pCVar4 = (this->contacts_).
                 super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>._M_impl
                 .super__Vector_impl_data._M_start;
        bVar10 = (ulong)(((long)(this->contacts_).
                                super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar4 >> 3) *
                        -0x71c71c71c71c71c7) <= uVar9;
        if (bVar10) {
          return bVar10;
        }
        bVar5 = Contact::operator==((Contact *)
                                    ((long)&(((Contact *)(&pCVar4->from_a + -0xc))->position).x +
                                    lVar8),(Contact *)
                                           ((long)&(((Contact *)
                                                    (&((other->contacts_).
                                                                                                              
                                                  super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->from_a
                                                  + -0xc))->position).x + lVar8));
        lVar8 = lVar8 + 0x48;
      } while (bVar5);
    }
  }
  else {
    bVar10 = false;
  }
  return bVar10;
}

Assistant:

bool Arbiter::operator==(const Arbiter& other) const {
  if (ArbiterKey(*this) != ArbiterKey(other)) {
    return false;
  }
  for (size_t i = 0; i < contacts_.size(); ++i) {
    if (contacts_[i] != other.contacts_[i]) {
      return false;
    }
  }
  return true;
}